

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O1

void zusolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  int iVar8;
  doublecomplex xj;
  doublecomplex local_40;
  
  if (0 < ncol) {
    pdVar7 = &M[((ulong)(uint)ncol - 1) * (long)ldm].i;
    iVar8 = 0;
    uVar6 = (ulong)(uint)ncol;
    uVar5 = ncol;
    do {
      uVar5 = uVar5 - 1;
      uVar1 = uVar6 - 1;
      z_div(&local_40,rhs + uVar1,M + uVar1 + (long)((int)uVar1 * ldm));
      rhs[uVar1].r = local_40.r;
      rhs[uVar1].i = local_40.i;
      if (1 < (long)uVar6) {
        lVar4 = 0;
        do {
          dVar2 = *(double *)((long)pdVar7 + lVar4 + -8);
          dVar3 = *(double *)((long)pdVar7 + lVar4);
          *(double *)((long)&rhs->r + lVar4) =
               *(double *)((long)&rhs->r + lVar4) - (local_40.r * dVar2 + dVar3 * -local_40.i);
          *(double *)((long)&rhs->i + lVar4) =
               *(double *)((long)&rhs->i + lVar4) - (dVar2 * local_40.i + dVar3 * local_40.r);
          lVar4 = lVar4 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar4);
      }
      iVar8 = iVar8 + 1;
      pdVar7 = pdVar7 + (long)ldm * -2;
      uVar6 = uVar1;
    } while (iVar8 != ncol);
  }
  return;
}

Assistant:

void zusolve (int ldm, int ncol, doublecomplex *M, doublecomplex *rhs)
{
    doublecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	z_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    zz_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    z_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}